

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_heal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_R8D;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = in_RCX->hit + 100;
  iVar2 = (int)in_RCX->max_hit;
  piVar3 = std::min<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
  in_RCX->hit = *piVar3;
  update_pos((CHAR_DATA *)CONCAT44(iVar1,iVar2));
  send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  if (in_RDX != in_RCX) {
    send_to_char((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX);
  }
  return;
}

Assistant:

void spell_heal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	victim->hit = std::min(victim->hit + 100, (int)victim->max_hit);

	update_pos(victim);
	send_to_char("A warm feeling fills your body.\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}